

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  char cVar1;
  xpath_ast_node *pxVar2;
  bool bVar3;
  int i;
  byte *pbVar4;
  long lVar5;
  char_t *__dest;
  char *pcVar6;
  char cVar7;
  byte bVar8;
  xpath_ast_node *pxVar9;
  ulong uVar10;
  xpath_ast_node **ppxVar11;
  char local_98 [128];
  
  if (this->_left != (xpath_ast_node *)0x0) {
    optimize(this->_left,alloc);
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    optimize(this->_right,alloc);
  }
  if (this->_next != (xpath_ast_node *)0x0) {
    optimize(this->_next,alloc);
  }
  ppxVar11 = &this->_right;
  bVar8 = this->_type;
  if ((bVar8 & 0xfe) == 0x10) {
    pxVar9 = *ppxVar11;
    if (pxVar9 == (xpath_ast_node *)0x0) {
      return;
    }
    if (((pxVar9->_type == '\x03') && (pxVar9->_left->_type == '\x16')) &&
       (pxVar2 = pxVar9->_right, pxVar2->_rettype == '\x02')) {
      *ppxVar11 = pxVar2;
      pxVar9 = pxVar2;
    }
    if (this->_test != '\0') {
      __assert_fail("_test == predicate_default",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                    ,0x2b23,
                    "void pugi::impl::(anonymous namespace)::xpath_ast_node::optimize_self(xpath_allocator *)"
                   );
    }
    if (((pxVar9->_type == '\x13') && ((pxVar9->_data).number == 1.0)) &&
       (!NAN((pxVar9->_data).number))) {
      this->_test = '\x03';
      return;
    }
    if (pxVar9->_rettype != '\x02') {
      bVar3 = is_posinv_expr(pxVar9);
      if (!bVar3) {
        return;
      }
      this->_test = '\x01';
      return;
    }
    if (2 < (byte)(pxVar9->_type - 0x13U)) {
      return;
    }
    this->_test = '\x02';
    return;
  }
  if (bVar8 == 0x2c) {
    pxVar9 = *ppxVar11;
    if (pxVar9 == (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar9->_type != '\x12') {
      return;
    }
    if (pxVar9->_next->_type != '\x12') {
      return;
    }
    pbVar4 = (byte *)(pxVar9->_data).string;
    pcVar6 = (pxVar9->_next->_data).string;
    local_98[0x70] = '\0';
    local_98[0x71] = '\0';
    local_98[0x72] = '\0';
    local_98[0x73] = '\0';
    local_98[0x74] = '\0';
    local_98[0x75] = '\0';
    local_98[0x76] = '\0';
    local_98[0x77] = '\0';
    local_98[0x78] = '\0';
    local_98[0x79] = '\0';
    local_98[0x7a] = '\0';
    local_98[0x7b] = '\0';
    local_98[0x7c] = '\0';
    local_98[0x7d] = '\0';
    local_98[0x7e] = '\0';
    local_98[0x7f] = '\0';
    local_98[0x60] = '\0';
    local_98[0x61] = '\0';
    local_98[0x62] = '\0';
    local_98[99] = '\0';
    local_98[100] = '\0';
    local_98[0x65] = '\0';
    local_98[0x66] = '\0';
    local_98[0x67] = '\0';
    local_98[0x68] = '\0';
    local_98[0x69] = '\0';
    local_98[0x6a] = '\0';
    local_98[0x6b] = '\0';
    local_98[0x6c] = '\0';
    local_98[0x6d] = '\0';
    local_98[0x6e] = '\0';
    local_98[0x6f] = '\0';
    local_98[0x50] = '\0';
    local_98[0x51] = '\0';
    local_98[0x52] = '\0';
    local_98[0x53] = '\0';
    local_98[0x54] = '\0';
    local_98[0x55] = '\0';
    local_98[0x56] = '\0';
    local_98[0x57] = '\0';
    local_98[0x58] = '\0';
    local_98[0x59] = '\0';
    local_98[0x5a] = '\0';
    local_98[0x5b] = '\0';
    local_98[0x5c] = '\0';
    local_98[0x5d] = '\0';
    local_98[0x5e] = '\0';
    local_98[0x5f] = '\0';
    local_98[0x40] = '\0';
    local_98[0x41] = '\0';
    local_98[0x42] = '\0';
    local_98[0x43] = '\0';
    local_98[0x44] = '\0';
    local_98[0x45] = '\0';
    local_98[0x46] = '\0';
    local_98[0x47] = '\0';
    local_98[0x48] = '\0';
    local_98[0x49] = '\0';
    local_98[0x4a] = '\0';
    local_98[0x4b] = '\0';
    local_98[0x4c] = '\0';
    local_98[0x4d] = '\0';
    local_98[0x4e] = '\0';
    local_98[0x4f] = '\0';
    local_98[0x30] = '\0';
    local_98[0x31] = '\0';
    local_98[0x32] = '\0';
    local_98[0x33] = '\0';
    local_98[0x34] = '\0';
    local_98[0x35] = '\0';
    local_98[0x36] = '\0';
    local_98[0x37] = '\0';
    local_98[0x38] = '\0';
    local_98[0x39] = '\0';
    local_98[0x3a] = '\0';
    local_98[0x3b] = '\0';
    local_98[0x3c] = '\0';
    local_98[0x3d] = '\0';
    local_98[0x3e] = '\0';
    local_98[0x3f] = '\0';
    local_98[0x20] = '\0';
    local_98[0x21] = '\0';
    local_98[0x22] = '\0';
    local_98[0x23] = '\0';
    local_98[0x24] = '\0';
    local_98[0x25] = '\0';
    local_98[0x26] = '\0';
    local_98[0x27] = '\0';
    local_98[0x28] = '\0';
    local_98[0x29] = '\0';
    local_98[0x2a] = '\0';
    local_98[0x2b] = '\0';
    local_98[0x2c] = '\0';
    local_98[0x2d] = '\0';
    local_98[0x2e] = '\0';
    local_98[0x2f] = '\0';
    local_98[0x10] = '\0';
    local_98[0x11] = '\0';
    local_98[0x12] = '\0';
    local_98[0x13] = '\0';
    local_98[0x14] = '\0';
    local_98[0x15] = '\0';
    local_98[0x16] = '\0';
    local_98[0x17] = '\0';
    local_98[0x18] = '\0';
    local_98[0x19] = '\0';
    local_98[0x1a] = '\0';
    local_98[0x1b] = '\0';
    local_98[0x1c] = '\0';
    local_98[0x1d] = '\0';
    local_98[0x1e] = '\0';
    local_98[0x1f] = '\0';
    local_98[0] = '\0';
    local_98[1] = '\0';
    local_98[2] = '\0';
    local_98[3] = '\0';
    local_98[4] = '\0';
    local_98[5] = '\0';
    local_98[6] = '\0';
    local_98[7] = '\0';
    local_98[8] = '\0';
    local_98[9] = '\0';
    local_98[10] = '\0';
    local_98[0xb] = '\0';
    local_98[0xc] = '\0';
    local_98[0xd] = '\0';
    local_98[0xe] = '\0';
    local_98[0xf] = '\0';
    while( true ) {
      uVar10 = (ulong)*pbVar4;
      if (uVar10 == 0) break;
      bVar8 = 0x2c;
      if (((char)*pbVar4 < '\0') || (cVar1 = *pcVar6, cVar1 < '\0')) goto LAB_00123112;
      if (local_98[uVar10] == '\0') {
        cVar7 = cVar1;
        if (cVar1 == '\0') {
          cVar7 = -0x80;
        }
        local_98[uVar10] = cVar7;
      }
      pbVar4 = pbVar4 + 1;
      pcVar6 = pcVar6 + (cVar1 != '\0');
    }
    for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
      if (local_98[lVar5] == '\0') {
        local_98[lVar5] = (char)lVar5;
      }
    }
    __dest = (char_t *)xpath_allocator::allocate(alloc,0x80);
    if (__dest != (char_t *)0x0) {
      memcpy(__dest,local_98,0x80);
      this->_type = ':';
      (this->_data).string = __dest;
      return;
    }
    bVar8 = this->_type;
  }
  else if (bVar8 == 0x38) {
    bVar8 = this->_axis;
    if (0xc < bVar8) {
      return;
    }
    if ((0x1038U >> (bVar8 & 0x1f) & 1) == 0) {
      return;
    }
    pxVar9 = this->_left;
    if (pxVar9 == (xpath_ast_node *)0x0) {
      return;
    }
    if (pxVar9->_type != '8') {
      return;
    }
    if (pxVar9->_axis != '\x05') {
      return;
    }
    if (pxVar9->_test != '\x02') {
      return;
    }
    if (pxVar9->_right != (xpath_ast_node *)0x0) {
      return;
    }
    while( true ) {
      pxVar2 = *ppxVar11;
      if (pxVar2 == (xpath_ast_node *)0x0) {
        this->_axis = (byte)(bVar8 - 3) < 2 ^ 5;
        this->_left = pxVar9->_left;
        return;
      }
      if (pxVar2->_type != '\x10') break;
      ppxVar11 = &pxVar2->_next;
      if (pxVar2->_test != '\x01') {
        return;
      }
    }
    __assert_fail("n->_type == ast_predicate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                  ,0x2b7b,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::is_posinv_step() const");
  }
LAB_00123112:
  if ((((((bVar8 == 3) && (pxVar9 = this->_left, pxVar9 != (xpath_ast_node *)0x0)) &&
        (pxVar2 = *ppxVar11, pxVar2 != (xpath_ast_node *)0x0)) &&
       ((pxVar9->_type == '8' && (pxVar9->_axis == '\x02')))) &&
      ((pxVar9->_test == '\x01' &&
       ((pxVar9->_left == (xpath_ast_node *)0x0 && (pxVar9->_right == (xpath_ast_node *)0x0)))))) &&
     ((pxVar2->_type == '\x12' || ((pxVar2->_type == '\x14' && (pxVar2->_rettype == '\x03')))))) {
    this->_type = ';';
  }
  return;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}